

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::tryParseDouble(char *s,char *s_end,double *result)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined8 in_XMM3_Qb;
  double local_48;
  undefined1 extraout_var [56];
  
  if (s_end <= s) {
LAB_0094ccaa:
    iVar9 = 0;
    goto LAB_0094ccad;
  }
  cVar6 = *s;
  if ((cVar6 == '-') || (cVar6 == '+')) {
    s = s + 1;
    if (s == s_end) goto LAB_0094cac6;
    auVar16 = ZEXT1664(ZEXT816(0));
    if (*s == 0x2e) {
LAB_0094cb45:
      auVar13 = auVar16._0_16_;
      if ((byte *)s + 1 != (byte *)s_end) {
        uVar7 = 1;
        iVar8 = -1;
        do {
          auVar13 = auVar16._0_16_;
          uVar4 = (uint)(char)((byte *)s)[uVar7];
          if (9 < uVar4 - 0x30) {
            s = (char *)((byte *)s + uVar7);
            goto LAB_0094cbce;
          }
          if (uVar7 < 8) {
            auVar11._8_8_ = 0;
            auVar11._0_8_ = tryParseDouble::pow_lut[uVar7];
          }
          else {
            auVar14._0_8_ = pow(10.0,(double)iVar8);
            auVar14._8_56_ = extraout_var;
            auVar11 = auVar14._0_16_;
          }
          auVar15._0_8_ = (double)(int)(uVar4 - 0x30);
          auVar15._8_8_ = in_XMM3_Qb;
          lVar5 = uVar7 + 1;
          iVar8 = iVar8 + -1;
          uVar7 = uVar7 + 1;
          auVar13 = vfmadd231sd_fma(auVar13,auVar11,auVar15);
          auVar16 = ZEXT1664(auVar13);
        } while ((byte *)s + lVar5 != (byte *)s_end);
      }
      goto LAB_0094cc86;
    }
LAB_0094cacf:
    auVar16 = ZEXT864(0) << 0x40;
    lVar5 = 0;
    do {
      pbVar10 = (byte *)s + lVar5;
      if (9 < (int)(char)*pbVar10 - 0x30U) {
        if ((int)lVar5 == 0) goto LAB_0094ccaa;
        s = (char *)((byte *)s + lVar5);
        goto LAB_0094cb26;
      }
      lVar3 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      dVar12 = auVar16._0_8_ * 10.0 + (double)(int)((int)(char)*pbVar10 - 0x30U);
      auVar16 = ZEXT864((ulong)dVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar12;
    } while ((byte *)s + lVar3 != (byte *)s_end);
  }
  else {
    if ((int)cVar6 - 0x30U < 10) {
      cVar6 = '+';
LAB_0094cac6:
      if (s == s_end) goto LAB_0094ccaa;
      goto LAB_0094cacf;
    }
    if (cVar6 != '.') goto LAB_0094ccaa;
    auVar16 = ZEXT1664(ZEXT816(0));
    cVar6 = '+';
LAB_0094cb26:
    auVar13 = auVar16._0_16_;
    bVar1 = *s;
    uVar4 = (uint)bVar1;
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
LAB_0094cbce:
      if ((uVar4 & 0xff | 0x20) == 0x65) {
        bVar1 = ((byte *)s)[1];
        pbVar10 = (byte *)s + 1;
        if ((pbVar10 == (byte *)s_end) || ((bVar1 != 0x2d && (bVar1 != 0x2b)))) {
          iVar8 = 1;
          if (9 < (int)(char)bVar1 - 0x30U) goto LAB_0094ccaa;
        }
        else {
          pbVar10 = (byte *)s + 2;
          iVar8 = ((bVar1 == 0x2b) - 1) + (uint)(bVar1 == 0x2b);
        }
        iVar9 = 0;
        if (pbVar10 == (byte *)s_end) goto LAB_0094ccad;
        lVar5 = 0;
        do {
          if (9 < (int)(char)pbVar10[lVar5] - 0x30U) {
            if ((int)lVar5 == 0) goto LAB_0094ccaa;
            break;
          }
          iVar9 = ((int)(char)pbVar10[lVar5] - 0x30U) + iVar9 * 10;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (pbVar10 + lVar3 != (byte *)s_end);
        if (iVar9 != 0) {
          dVar12 = pow(5.0,(double)(iVar9 * iVar8));
          local_48 = auVar13._0_8_;
          auVar16._0_8_ = ldexp(dVar12 * local_48,iVar9 * iVar8);
          auVar16._8_56_ = extraout_var_00;
          auVar13 = auVar16._0_16_;
        }
      }
    }
    else if (bVar1 == 0x2e) goto LAB_0094cb45;
  }
LAB_0094cc86:
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar13,auVar2);
  iVar9 = 1;
  *result = (double)((ulong)(cVar6 == '+') * auVar13._0_8_ + (ulong)(cVar6 != '+') * auVar11._0_8_);
LAB_0094ccad:
  return SUB41(iVar9,0);
}

Assistant:

static bool tryParseDouble(const char *s, const char *s_end, double *result) {
  if (s >= s_end) {
    return false;
  }

  double mantissa = 0.0;
  // This exponent is base 2 rather than 10.
  // However the exponent we parse is supposed to be one of ten,
  // thus we must take care to convert the exponent/and or the
  // mantissa to a * 2^E, where a is the mantissa and E is the
  // exponent.
  // To get the final double we will use ldexp, it requires the
  // exponent to be in base 2.
  int exponent = 0;

  // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
  // TO JUMP OVER DEFINITIONS.
  char sign = '+';
  char exp_sign = '+';
  char const *curr = s;

  // How many characters were read in a loop.
  int read = 0;
  // Tells whether a loop terminated due to reaching s_end.
  bool end_not_reached = false;
  bool leading_decimal_dots = false;

  /*
          BEGIN PARSING.
  */

  // Find out what sign we've got.
  if (*curr == '+' || *curr == '-') {
    sign = *curr;
    curr++;
    if ((curr != s_end) && (*curr == '.')) {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    }
  } else if (IS_DIGIT(*curr)) { /* Pass through. */
  } else if (*curr == '.') {
    // accept. Somethig like `.7e+2`, `-.5234`
    leading_decimal_dots = true;
  } else {
    goto fail;
  }

  // Read the integer part.
  end_not_reached = (curr != s_end);
  if (!leading_decimal_dots) {
    while (end_not_reached && IS_DIGIT(*curr)) {
      mantissa *= 10;
      mantissa += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }

    // We must make sure we actually got something.
    if (read == 0) goto fail;
  }

  // We allow numbers of form "#", "###" etc.
  if (!end_not_reached) goto assemble;

  // Read the decimal part.
  if (*curr == '.') {
    curr++;
    read = 1;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      static const double pow_lut[] = {
          1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
      };
      const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

      // NOTE: Don't use powf here, it will absolutely murder precision.
      mantissa += static_cast<int>(*curr - 0x30) *
                  (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
      read++;
      curr++;
      end_not_reached = (curr != s_end);
    }
  } else if (*curr == 'e' || *curr == 'E') {
  } else {
    goto assemble;
  }

  if (!end_not_reached) goto assemble;

  // Read the exponent part.
  if (*curr == 'e' || *curr == 'E') {
    curr++;
    // Figure out if a sign is present and if it is.
    end_not_reached = (curr != s_end);
    if (end_not_reached && (*curr == '+' || *curr == '-')) {
      exp_sign = *curr;
      curr++;
    } else if (IS_DIGIT(*curr)) { /* Pass through. */
    } else {
      // Empty E is not allowed.
      goto fail;
    }

    read = 0;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      exponent *= 10;
      exponent += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }
    exponent *= (exp_sign == '+' ? 1 : -1);
    if (read == 0) goto fail;
  }

assemble:
  *result = (sign == '+' ? 1 : -1) *
            (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                      : mantissa);
  return true;
fail:
  return false;
}